

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::descriptor_unittest::ValidationErrorTest_ReservedFieldsDebugString2023_Test::
TestBody(ValidationErrorTest_ReservedFieldsDebugString2023_Test *this)

{
  bool bVar1;
  FileDescriptor *this_00;
  char *message;
  AssertHelper local_78;
  Message local_70 [3];
  string local_58;
  undefined1 local_38 [8];
  AssertionResult gtest_ar;
  FileDescriptor *file;
  ValidationErrorTest_ReservedFieldsDebugString2023_Test *this_local;
  
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&gtest_ar.message_,
             "\n    syntax: \"editions\"\n    edition: EDITION_2023\n    name: \"foo.proto\"\n    message_type {\n      name: \"Foo\"\n      reserved_name: \"foo\"\n      reserved_name: \"bar\"\n      reserved_range { start: 5 end: 6 }\n      reserved_range { start: 10 end: 20 }\n    }"
            );
  this_00 = ValidationErrorTest::BuildFile(&this->super_ValidationErrorTest,stack0xffffffffffffffd8)
  ;
  FileDescriptor::DebugString_abi_cxx11_(&local_58,this_00);
  testing::internal::EqHelper::
  Compare<char[82],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_38,
             "\"edition = \\\"2023\\\";\\n\\n\" \"message Foo {\\n\" \"  reserved 5, 10 to 19;\\n\" \"  reserved foo, bar;\\n\" \"}\\n\\n\""
             ,"file->DebugString()",
             (char (*) [82])
             "edition = \"2023\";\n\nmessage Foo {\n  reserved 5, 10 to 19;\n  reserved foo, bar;\n}\n\n"
             ,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar1) {
    testing::Message::Message(local_70);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_38);
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x13a4,message);
    testing::internal::AssertHelper::operator=(&local_78,local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    testing::Message::~Message(local_70);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  return;
}

Assistant:

TEST_F(ValidationErrorTest, ReservedFieldsDebugString2023) {
  const FileDescriptor* file = BuildFile(R"pb(
    syntax: "editions"
    edition: EDITION_2023
    name: "foo.proto"
    message_type {
      name: "Foo"
      reserved_name: "foo"
      reserved_name: "bar"
      reserved_range { start: 5 end: 6 }
      reserved_range { start: 10 end: 20 }
    })pb");

  ASSERT_EQ(
      "edition = \"2023\";\n\n"
      "message Foo {\n"
      "  reserved 5, 10 to 19;\n"
      "  reserved foo, bar;\n"
      "}\n\n",
      file->DebugString());
}